

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walIndexTryHdr(Wal *pWal,int *pChanged)

{
  int iVar1;
  WalIndexHdr *__src;
  undefined4 *in_RSI;
  Wal *in_RDI;
  long in_FS_OFFSET;
  WalIndexHdr *aHdr;
  WalIndexHdr h2;
  WalIndexHdr h1;
  u32 aCksum [2];
  int local_74;
  undefined1 local_70 [48];
  u8 local_40 [12];
  char local_34;
  u32 local_18;
  int local_14;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  memset(local_40,0xaa,0x30);
  memset(local_70,0xaa,0x30);
  __src = walIndexHdr(in_RDI);
  memcpy(local_40,__src,0x30);
  walShmBarrier((Wal *)0x15fb15);
  memcpy(local_70,__src + 1,0x30);
  iVar1 = memcmp(local_40,local_70,0x30);
  if (iVar1 == 0) {
    if (local_34 == '\0') {
      local_74 = 1;
    }
    else {
      walChecksumBytes(1,local_40,0x28,(u32 *)0x0,(u32 *)&local_10);
      if (((u32)local_10 == local_18) && (local_10._4_4_ == local_14)) {
        iVar1 = memcmp(&in_RDI->hdr,local_40,0x30);
        if (iVar1 != 0) {
          *in_RSI = 1;
          memcpy(&in_RDI->hdr,local_40,0x30);
          in_RDI->szPage = ((in_RDI->hdr).szPage & 0xfe00) + ((in_RDI->hdr).szPage & 1) * 0x10000;
        }
        local_74 = 0;
      }
      else {
        local_74 = 1;
      }
    }
  }
  else {
    local_74 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_74;
  }
  __stack_chk_fail();
}

Assistant:

static SQLITE_NO_TSAN int walIndexTryHdr(Wal *pWal, int *pChanged){
  u32 aCksum[2];                  /* Checksum on the header content */
  WalIndexHdr h1, h2;             /* Two copies of the header content */
  WalIndexHdr volatile *aHdr;     /* Header in shared memory */

  /* The first page of the wal-index must be mapped at this point. */
  assert( pWal->nWiData>0 && pWal->apWiData[0] );

  /* Read the header. This might happen concurrently with a write to the
  ** same area of shared memory on a different CPU in a SMP,
  ** meaning it is possible that an inconsistent snapshot is read
  ** from the file. If this happens, return non-zero.
  **
  ** tag-20200519-1:
  ** There are two copies of the header at the beginning of the wal-index.
  ** When reading, read [0] first then [1].  Writes are in the reverse order.
  ** Memory barriers are used to prevent the compiler or the hardware from
  ** reordering the reads and writes.  TSAN and similar tools can sometimes
  ** give false-positive warnings about these accesses because the tools do not
  ** account for the double-read and the memory barrier. The use of mutexes
  ** here would be problematic as the memory being accessed is potentially
  ** shared among multiple processes and not all mutex implementations work
  ** reliably in that environment.
  */
  aHdr = walIndexHdr(pWal);
  memcpy(&h1, (void *)&aHdr[0], sizeof(h1)); /* Possible TSAN false-positive */
  walShmBarrier(pWal);
  memcpy(&h2, (void *)&aHdr[1], sizeof(h2));

  if( memcmp(&h1, &h2, sizeof(h1))!=0 ){
    return 1;   /* Dirty read */
  }
  if( h1.isInit==0 ){
    return 1;   /* Malformed header - probably all zeros */
  }
  walChecksumBytes(1, (u8*)&h1, sizeof(h1)-sizeof(h1.aCksum), 0, aCksum);
  if( aCksum[0]!=h1.aCksum[0] || aCksum[1]!=h1.aCksum[1] ){
    return 1;   /* Checksum does not match */
  }

  if( memcmp(&pWal->hdr, &h1, sizeof(WalIndexHdr)) ){
    *pChanged = 1;
    memcpy(&pWal->hdr, &h1, sizeof(WalIndexHdr));
    pWal->szPage = (pWal->hdr.szPage&0xfe00) + ((pWal->hdr.szPage&0x0001)<<16);
    testcase( pWal->szPage<=32768 );
    testcase( pWal->szPage>=65536 );
  }

  /* The header was successfully read. Return zero. */
  return 0;
}